

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O2

_Bool ts_node__is_relevant(TSNode self,_Bool include_anonymous)

{
  Subtree self_00;
  _Bool _Var1;
  uint uVar2;
  undefined7 in_register_00000039;
  
  self_00 = *self.id;
  if ((int)CONCAT71(in_register_00000039,include_anonymous) != 0) {
    if (((ulong)self_00.ptr & 1) == 0) {
      uVar2 = (uint)*(ushort *)&(self_00.ptr)->field_0x2c;
    }
    else {
      uVar2 = self_00._0_4_ >> 1;
    }
    if ((uVar2 & 1) != 0) {
      return true;
    }
    return self.context[3] != 0;
  }
  if (((ulong)self_00.ptr & 1) == 0) {
    uVar2 = (uint)*(ushort *)&(self_00.ptr)->field_0x2c;
  }
  else {
    uVar2 = (uint)((ulong)self_00.ptr >> 1) & 0x7fffffff;
  }
  if (((uVar2 & 1) != 0) && (_Var1 = ts_subtree_named(self_00), _Var1)) {
    return true;
  }
  if (self.context[3] != 0) {
    if ((ushort)self.context[3] == 0xffff) {
      return true;
    }
    if ((self.context[3] & 0xffff) != 0xfffe) {
      return (_Bool)(((byte)(self.tree)->language->symbol_metadata[(ushort)self.context[3]] & 2) >>
                    1);
    }
  }
  return false;
}

Assistant:

static inline bool ts_node__is_relevant(TSNode self, bool include_anonymous) {
  Subtree tree = ts_node__subtree(self);
  if (include_anonymous) {
    return ts_subtree_visible(tree) || ts_node__alias(&self);
  } else {
    return
      (ts_subtree_visible(tree) &&
       ts_subtree_named(tree)) ||
      (ts_node__alias(&self) &&
       ts_language_symbol_metadata(self.tree->language, ts_node__alias(&self)).named);
  }
}